

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O3

void __thiscall
jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::clear
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this)

{
  long lVar1;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *pbVar2;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *pbVar3;
  pointer pkVar4;
  pointer pkVar5;
  long *plVar6;
  byte bVar7;
  object *poVar8;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  pointer pkVar10;
  
  for (; bVar7 = (byte)*(object_storage *)this & 0xf, bVar7 == 9;
      this = *(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> **)
              ((long)this + 8)) {
  }
  if (bVar7 == 0xd) {
    poVar8 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage
             ::value_abi_cxx11_((object_storage *)this);
    pkVar4 = (poVar8->members_).
             super__Vector_base<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pkVar5 = (poVar8->members_).
             super__Vector_base<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pkVar5 != pkVar4) {
      paVar9 = &(pkVar4->key_).field_2;
      do {
        destroy((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                (paVar9 + 1));
        plVar6 = (long *)(((key_type *)(paVar9 + -1))->_M_dataplus)._M_p;
        if (paVar9 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)plVar6) {
          operator_delete(plVar6,paVar9->_M_allocated_capacity + 1);
        }
        pkVar10 = (pointer)(paVar9 + 2);
        paVar9 = paVar9 + 3;
      } while (pkVar10 != pkVar5);
      (poVar8->members_).
      super__Vector_base<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pkVar4;
    }
  }
  else if (bVar7 == 0xe) {
    lVar1 = *(long *)((long)this + 8);
    pbVar2 = *(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> **)
              (lVar1 + 8);
    pbVar3 = *(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> **)
              (lVar1 + 0x10);
    this_00 = pbVar2;
    if (pbVar3 != pbVar2) {
      do {
        destroy(this_00);
        this_00 = this_00 + 1;
      } while (this_00 != pbVar3);
      *(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> **)(lVar1 + 0x10)
           = pbVar2;
    }
  }
  return;
}

Assistant:

void clear()
        {
            switch (storage_kind())
            {
                case json_storage_kind::array:
                    cast<array_storage>().value().clear();
                    break;
                case json_storage_kind::object:
                    cast<object_storage>().value().clear();
                    break;
                case json_storage_kind::json_reference:
                    cast<json_reference_storage>().value().clear();
                    break;
                default:
                    break;
            }
        }